

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_rfc6979_hmac_sha256_generate
               (secp256k1_rfc6979_hmac_sha256 *rng,uchar *out,size_t outlen)

{
  uchar *key;
  int iVar1;
  size_t keylen;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n;
  long lVar2;
  secp256k1_hmac_sha256 hmac;
  
  if (rng->retry != 0) {
    key = rng->k;
    secp256k1_hmac_sha256_initialize(&hmac,key,outlen);
    secp256k1_sha256_write(&hmac.inner,rng->v,0x20);
    secp256k1_sha256_write(&hmac.inner,"",1);
    secp256k1_hmac_sha256_finalize(&hmac,key);
    secp256k1_hmac_sha256_initialize(&hmac,key,keylen);
    secp256k1_sha256_write(&hmac.inner,rng->v,0x20);
    secp256k1_hmac_sha256_finalize(&hmac,rng->v);
    outlen = extraout_RDX;
  }
  for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 - __n) {
    secp256k1_hmac_sha256_initialize(&hmac,rng->k,outlen);
    secp256k1_sha256_write(&hmac.inner,rng->v,0x20);
    secp256k1_hmac_sha256_finalize(&hmac,rng->v);
    iVar1 = 0x20;
    if ((int)lVar2 < 0x20) {
      iVar1 = (int)lVar2;
    }
    __n = (size_t)iVar1;
    memcpy(out,rng,__n);
    out = out + __n;
    outlen = extraout_RDX_00;
  }
  rng->retry = 1;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_generate(secp256k1_rfc6979_hmac_sha256 *rng, unsigned char *out, size_t outlen) {
    /* RFC6979 3.2.h. */
    static const unsigned char zero[1] = {0x00};
    if (rng->retry) {
        secp256k1_hmac_sha256 hmac;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_write(&hmac, zero, 1);
        secp256k1_hmac_sha256_finalize(&hmac, rng->k);
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    }

    while (outlen > 0) {
        secp256k1_hmac_sha256 hmac;
        int now = outlen;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
        if (now > 32) {
            now = 32;
        }
        memcpy(out, rng->v, now);
        out += now;
        outlen -= now;
    }

    rng->retry = 1;
}